

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asp_preprocessor.cpp
# Opt level: O1

ValueRep __thiscall Clasp::Asp::Preprocessor::simplifyHead(Preprocessor *this,PrgHead *h,bool more)

{
  uint uVar1;
  EdgeType EVar2;
  PrgNode PVar3;
  PrgNode PVar4;
  PrgEdge *first;
  EdgeType *pEVar5;
  bool bVar6;
  ValueRep VVar7;
  byte bVar8;
  ulong uVar9;
  EdgeType EVar10;
  long lVar11;
  uint32 uVar12;
  PrgBody *pPVar13;
  uint32 numSuppLits;
  EdgeVec temp;
  allocator_type local_45;
  uint32 local_44;
  EdgeType *local_40;
  uint local_38;
  
  PVar3 = h->super_PrgNode;
  if ((PVar3._0_4_ & 0x7fffffff) == 1 || ((ulong)PVar3 >> 0x3e & 1) != 0) {
    uVar9 = 1;
    if ((~(ulong)PVar3 & 0xfffffff00000000) == 0) {
      uVar9 = 0xcfffffff00000001;
    }
    if (((ulong)PVar3 & 0x4000000000000000) == 0) {
      uVar9 = 0xcfffffff00000001;
    }
    h->super_PrgNode = (PrgNode)(uVar9 | (ulong)PVar3 & 0xffffffff80000000);
    PrgHead::clearSupports(h);
    h->field_0x1b = h->field_0x1b & 0xf7;
    VVar7 = '\x01';
  }
  else {
    if ((h->supports_).ebo_.size == 0) {
      uVar12 = 0xffffffff;
    }
    else {
      uVar12 = ((h->supports_).ebo_.buf)->rep;
    }
    local_44 = 0;
    bVar6 = PrgHead::simplifySupports(h,this->prg_,true,&local_44);
    VVar7 = '\x02';
    if (bVar6) {
      PVar4 = h->super_PrgNode;
      bVar8 = PVar4._7_1_ >> 4 & 3;
      VVar7 = '\x01';
      if (((PVar3._7_1_ >> 4 & 3) != bVar8) &&
         ((bVar8 == 2 || ((bVar8 == 1 && (((ulong)PVar4 & 0x7ffffffe) != 0)))))) {
        VVar7 = '\x03';
      }
      if (more) {
        if ((PVar4._0_4_ & 0x7fffffff) == 1 || local_44 != 0) {
          uVar1 = (h->supports_).ebo_.size;
          if (((ulong)uVar1 == 0) || (((h->supports_).ebo_.buf)->rep == uVar12)) {
            if (uVar1 != 1 || (uVar12 & 2) != 0) {
              if (local_44 != 1 || uVar1 < 2) {
                return VVar7;
              }
              if (-1 < *(int *)&h->field_0x18) {
                return VVar7;
              }
            }
            pPVar13 = (this->prg_->bodies_).ebo_.buf[uVar12 >> 4];
            if (((PVar4._0_4_ ^ *(uint *)&pPVar13->super_PrgNode) & 0x7fffffff) == 0) {
              return VVar7;
            }
            if (1 < uVar1) {
              first = (h->supports_).ebo_.buf;
              bk_lib::pod_vector<Clasp::Asp::PrgEdge,std::allocator<Clasp::Asp::PrgEdge>>::
              pod_vector<Clasp::Asp::PrgEdge_const*>
                        ((pod_vector<Clasp::Asp::PrgEdge,std::allocator<Clasp::Asp::PrgEdge>> *)
                         &local_40,first,first + uVar1,&local_45,(type_conflict *)0x0);
              PrgHead::clearSupports(h);
              pEVar5 = local_40;
              EVar10 = *local_40;
              if ((ulong)local_38 != 0) {
                lVar11 = 0;
                do {
                  EVar2 = *(EdgeType *)((long)pEVar5 + lVar11);
                  pPVar13 = (this->prg_->bodies_).ebo_.buf[EVar2 >> 4];
                  if ((((EVar2 & Choice) == Normal) &&
                      ((*(uint *)&pPVar13->field_0x8 & 0x1ffffff) == 1)) &&
                     (((ulong)(&pPVar13[1].super_PrgNode)
                              [(*(uint *)&pPVar13->field_0x8 & 0x18000000) != 0] & 2) != 0)) {
                    EVar10 = EVar2;
                  }
                  PrgBody::removeHead(pPVar13,h,EVar2 & GammaChoice);
                  lVar11 = lVar11 + 4;
                } while ((ulong)local_38 << 2 != lVar11);
              }
              pPVar13 = (this->prg_->bodies_).ebo_.buf[EVar10 >> 4];
              PrgBody::addHead(pPVar13,h,EVar10 & GammaChoice);
              bVar6 = PrgBody::simplifyHeads(pPVar13,this->prg_,true);
              if (local_40 != (EdgeType *)0x0) {
                operator_delete(local_40);
              }
              if (!bVar6) {
                return '\x02';
              }
            }
            if ((~(SUB84(h->super_PrgNode,4) >> 0x1c) & 1) == 0) {
              PrgBody::assignValue(pPVar13,SUB81(h->super_PrgNode,7) >> 4 & 3);
              PrgBody::propagateValue(pPVar13,this->prg_,true);
            }
          }
        }
        VVar7 = '\x03';
      }
    }
  }
  return VVar7;
}

Assistant:

ValueRep Preprocessor::simplifyHead(PrgHead* h, bool more) {
	if (!h->hasVar() || !h->relevant()) {
		// unsupported or eq
		h->clearLiteral(false);
		h->markRemoved();
		h->clearSupports();
		h->setInUpper(false);
		return value_true;
	}
	assert(h->inUpper());
	ValueRep v       = h->value();
	ValueRep ret     = value_true;
	PrgEdge support  = h->supports() ? *h->supps_begin() : PrgEdge::noEdge();
	uint32 numSuppLits= 0;
	if (!h->simplifySupports(*prg_, true, &numSuppLits)) {
		return value_false;
	}
	if (v != h->value() && (h->value() == value_false || (h->value() == value_true && h->var() != 0))) {
		ret = value_weak_true;
	}
	if (more) {
		if (numSuppLits == 0 && h->hasVar()) {
			// unsupported head does not need a variable
			ret = value_weak_true;
		}
		else if (h->supports() > 0 && h->supps_begin()->rep != support.rep) {
			// support for head has changed
			ret = value_weak_true;
		}
		else if ((support.isNormal() && h->supports() == 1) || (h->supports() > 1 && numSuppLits == 1 && h->isAtom())) {
			assert(support.isBody());
			PrgBody* supBody = prg_->getBody(support.node());
			if (supBody->literal() != h->literal()) {
				if (h->supports() > 1) {
					// atom is equivalent to one of its bodies
					EdgeVec temp(h->supps_begin(), h->supps_end());
					h->clearSupports();
					support = temp[0];
					for (EdgeIterator it = temp.begin(), end = temp.end(); it != end; ++it) {
						assert(!it->isDisj());
						PrgBody* B = prg_->getBody(it->node());
						if (it->isNormal() && B->size() == 1 && B->goal(0).sign()) {
							support = *it;
						}
						B->removeHead(h, it->type());
					}
					supBody = prg_->getBody(support.node());
					supBody->addHead(h, support.type());
					if (!supBody->simplifyHeads(*prg_, true)) {
						return value_false;
					}
				}
				ret = value_weak_true;
				if (h->value() == value_weak_true || h->value() == value_true) {
					supBody->assignValue(h->value());
					supBody->propagateValue(*prg_, true);
				}
			}
		}
	}
	return ret;
}